

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermReader.h
# Opt level: O3

void aeron::concurrent::logbuffer::TermReader::
     read<std::function<void(aeron::concurrent::AtomicBuffer&,int,int,aeron::concurrent::logbuffer::Header&)>&>
               (ReadOutcome *outcome,AtomicBuffer *termBuffer,int32_t termOffset,
               function<void_(aeron::concurrent::AtomicBuffer_&,_int,_int,_aeron::concurrent::logbuffer::Header_&)>
               *handler,int fragmentsLimit,Header *header,exception_handler_t *exceptionHandler)

{
  length_t lVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int local_40;
  int local_3c;
  _Any_data *local_38;
  
  outcome->fragmentsRead = 0;
  outcome->offset = termOffset;
  lVar1 = termBuffer->m_length;
  iVar4 = termOffset;
  local_38 = (_Any_data *)handler;
  if (termOffset < (int)lVar1 && 0 < fragmentsLimit) {
    while( true ) {
      AtomicBuffer::boundsCheck(termBuffer,termOffset,4);
      iVar2 = *(int *)(termBuffer->m_buffer + termOffset);
      iVar4 = termOffset;
      if (iVar2 < 1) break;
      iVar4 = (iVar2 + 0x1fU & 0xffffffe0) + termOffset;
      lVar3 = (long)termOffset + 6;
      AtomicBuffer::boundsCheck(termBuffer,(index_t)lVar3,2);
      if (*(short *)(termBuffer->m_buffer + lVar3) == 0) {
        iVar2 = outcome->fragmentsRead;
      }
      else {
        (header->m_buffer).m_buffer = termBuffer->m_buffer;
        (header->m_buffer).m_length = termBuffer->m_length;
        header->m_offset = termOffset;
        local_3c = termOffset + 0x20;
        local_40 = iVar2 + -0x20;
        if (*(long *)(local_38 + 1) == 0) {
          std::__throw_bad_function_call();
        }
        (**(code **)(local_38->_M_pod_data + 0x18))(local_38,termBuffer,&local_3c,&local_40,header);
        iVar2 = outcome->fragmentsRead + 1;
        outcome->fragmentsRead = iVar2;
      }
      if ((fragmentsLimit <= iVar2) || (termOffset = iVar4, (int)lVar1 <= iVar4)) break;
    }
  }
  outcome->offset = iVar4;
  return;
}

Assistant:

inline void read(
    ReadOutcome& outcome,
    AtomicBuffer& termBuffer,
    std::int32_t termOffset,
    F&& handler,
    int fragmentsLimit,
    Header& header,
    const exception_handler_t & exceptionHandler)
{
    outcome.fragmentsRead = 0;
    outcome.offset = termOffset;
    const util::index_t capacity = termBuffer.capacity();

    try
    {
        while (outcome.fragmentsRead < fragmentsLimit && termOffset < capacity)
        {
            const std::int32_t frameLength = FrameDescriptor::frameLengthVolatile(termBuffer, termOffset);
            if (frameLength <= 0)
            {
                break;
            }

            const std::int32_t fragmentOffset = termOffset;
            termOffset += util::BitUtil::align(frameLength, FrameDescriptor::FRAME_ALIGNMENT);

            if (!FrameDescriptor::isPaddingFrame(termBuffer, fragmentOffset))
            {
                header.buffer(termBuffer);
                header.offset(fragmentOffset);
                handler(termBuffer, fragmentOffset + DataFrameHeader::LENGTH, frameLength - DataFrameHeader::LENGTH, header);

                ++outcome.fragmentsRead;
            }
        }
    }
    catch (const std::exception& ex)
    {
        exceptionHandler(ex);
    }

    outcome.offset = termOffset;
}